

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_access_block_ptr(Integer g_a,Integer idx,void *ptr,Integer *ld)

{
  short sVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ushort uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  global_array_t *pgVar12;
  char *pcVar13;
  long lVar14;
  int _index [7];
  Integer lo [7];
  Integer hi [7];
  
  lVar7 = g_a + 1000;
  lVar3 = (long)GA[lVar7].ndim;
  if ((idx < 0) || (pcVar13 = (char *)g_a, GA[lVar7].block_total <= idx)) {
    pcVar13 = "block index outside allowed values";
    pnga_error("block index outside allowed values",idx);
  }
  if (GA[lVar7].distr_type - 2U < 3) {
    sVar1 = GA[lVar7].ndim;
    lo[0] = (long)(int)idx % GA[lVar7].num_blocks[0];
    lVar7 = lo[0];
    lVar3 = 0;
    while (lVar3 + 1 < (long)sVar1) {
      idx = ((int)idx - lVar7) / GA[g_a + 1000].num_blocks[lVar3];
      lVar7 = (long)(int)idx % GA[g_a + 1000].num_blocks[lVar3 + 1];
      lo[lVar3 + 1] = lVar7;
      lVar3 = lVar3 + 1;
    }
    pnga_access_block_grid_ptr(g_a,lo,hi,ld);
    pcVar13 = (char *)hi[0];
  }
  else if (GA[lVar7].distr_type == 1) {
    pgVar12 = GA + lVar7;
    lVar7 = 0;
    if (0 < lVar3) {
      lVar7 = lVar3;
    }
    lVar14 = 0;
    for (lVar6 = idx % GAnproc; lVar6 < idx; lVar6 = lVar6 + GAnproc) {
      sVar1 = pgVar12->ndim;
      lVar8 = (long)(int)lVar6 % pgVar12->num_blocks[0];
      _index[0] = (int)lVar8;
      lVar4 = lVar6;
      lVar10 = 0;
      while (lVar10 + 1 < (long)sVar1) {
        lVar4 = (long)((int)lVar4 - (int)lVar8) / GA[g_a + 1000].num_blocks[lVar10];
        lVar8 = (long)(int)lVar4 % GA[g_a + 1000].num_blocks[lVar10 + 1];
        _index[lVar10 + 1] = (int)lVar8;
        lVar10 = lVar10 + 1;
      }
      uVar11 = (uint)sVar1;
      if (sVar1 < 1) {
        uVar11 = 0;
      }
      for (uVar9 = 0; (uVar11 & 0xffff) << 2 != uVar9; uVar9 = uVar9 + 4) {
        iVar2 = *(int *)((long)_index + uVar9);
        lVar4 = *(long *)((long)GA[g_a + 1000].block_dims + uVar9 * 2);
        *(long *)((long)lo + uVar9 * 2) = lVar4 * iVar2 + 1;
        lVar4 = ((long)iVar2 + 1) * lVar4;
        lVar10 = *(long *)((long)GA[g_a + 1000].dims + uVar9 * 2);
        if (lVar10 <= lVar4) {
          lVar4 = lVar10;
        }
        *(long *)((long)hi + uVar9 * 2) = lVar4;
      }
      lVar4 = 1;
      for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
        lVar4 = lVar4 * ((hi[lVar10] - lo[lVar10]) + 1);
      }
      lVar14 = lVar14 + lVar4;
    }
    pcVar13 = pgVar12->ptr[idx % GAnproc] + lVar14 * pgVar12->elemsize;
    uVar5 = pgVar12->ndim;
    lVar6 = (long)(int)idx % pgVar12->num_blocks[0];
    _index[0] = (int)lVar6;
    lVar7 = 0;
    while (lVar7 + 1 < (long)(short)uVar5) {
      idx = (long)((int)idx - (int)lVar6) / GA[g_a + 1000].num_blocks[lVar7];
      lVar6 = (long)(int)idx % GA[g_a + 1000].num_blocks[lVar7 + 1];
      _index[lVar7 + 1] = (int)lVar6;
      lVar7 = lVar7 + 1;
    }
    lVar7 = 0;
    if ((short)uVar5 < 1) {
      uVar5 = 0;
    }
    for (; (ulong)uVar5 * 4 != lVar7; lVar7 = lVar7 + 4) {
      iVar2 = *(int *)((long)_index + lVar7);
      lVar6 = *(long *)((long)GA[g_a + 1000].block_dims + lVar7 * 2);
      *(long *)((long)lo + lVar7 * 2) = lVar6 * iVar2 + 1;
      lVar6 = ((long)iVar2 + 1) * lVar6;
      lVar14 = *(long *)((long)GA[g_a + 1000].dims + lVar7 * 2);
      if (lVar14 <= lVar6) {
        lVar6 = lVar14;
      }
      *(long *)((long)hi + lVar7 * 2) = lVar6;
    }
    lVar7 = 1;
    if (1 < lVar3) {
      lVar7 = lVar3;
    }
    for (lVar3 = 0; lVar7 + -1 != lVar3; lVar3 = lVar3 + 1) {
      ld[lVar3] = (hi[lVar3] - lo[lVar3]) + 1;
    }
  }
  *(char **)ptr = pcVar13;
  return;
}

Assistant:

void pnga_access_block_ptr(Integer g_a, Integer idx, void* ptr, Integer *ld)
            /* g_a: array handle [input]
             * idx: block index  [input]
             * ptr: pointer to data in block [output]
             * ld:  array of strides for block data [output]
             */
{
  char *lptr;
  Integer  handle = GA_OFFSET + g_a;
  Integer  i, j/*, p_handle*/, nblocks, offset, tsum, inode;
  Integer ndim, lo[MAXDIM], hi[MAXDIM], index;

  
  /*p_handle = GA[handle].p_handle;*/
  nblocks = GA[handle].block_total;
  ndim = GA[handle].ndim;
  index = idx;
  if (index < 0 || index >= nblocks)
    pnga_error("block index outside allowed values",index);

  if (GA[handle].distr_type == BLOCK_CYCLIC) {
    offset = 0;
    inode = index%GAnproc;
    for (i=inode; i<index; i += GAnproc) {
      ga_ownsM(handle,i,lo,hi); 
      tsum = 1;
      for (j=0; j<ndim; j++) {
        tsum *= (hi[j]-lo[j]+1);
      }
      offset += tsum;
    }
    lptr = GA[handle].ptr[inode]+offset*GA[handle].elemsize;

    ga_ownsM(handle,index,lo,hi); 
    for (i=0; i<ndim-1; i++) {
      ld[i] = hi[i]-lo[i]+1;
    }
  } else if (GA[handle].distr_type == SCALAPACK ||
      GA[handle].distr_type == TILED ||
      GA[handle].distr_type == TILED_IRREG) {
    Integer indices[MAXDIM];
    /* find block indices */
    gam_find_block_indices(handle,index,indices);
    /* find pointer */
    pnga_access_block_grid_ptr(g_a, indices, &lptr, ld);
  }
  *(char**)ptr = lptr; 

}